

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSizeAllocationsManager.hpp
# Opt level: O2

void __thiscall
Diligent::VariableSizeAllocationsManager::VariableSizeAllocationsManager
          (VariableSizeAllocationsManager *this,CreateInfo *CI)

{
  OffsetType Size;
  allocator_type local_48;
  
  local_48.m_Allocator = CI->Allocator;
  local_48.m_dvpDescription = "Allocator for map<OffsetType, FreeBlockInfo>";
  local_48.m_dvpFileName =
       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
  ;
  local_48.m_dvpLineNumber = 0x6d;
  std::
  map<unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
  ::map(&this->m_FreeBlocksByOffset,&local_48);
  local_48.m_Allocator = CI->Allocator;
  local_48.m_dvpDescription = "Allocator for multimap<OffsetType, TFreeBlocksByOffsetMap::iterator>"
  ;
  local_48.m_dvpFileName =
       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
  ;
  local_48.m_dvpLineNumber = 0x6e;
  std::
  multimap<unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
  ::multimap(&this->m_FreeBlocksBySize,(allocator_type *)&local_48);
  Size = CI->MaxSize;
  this->m_MaxSize = Size;
  this->m_FreeSize = Size;
  this->m_CurrAlignment = 0;
  this->m_DbgDisableDebugValidation = CI->DbgDisableDebugValidation;
  AddNewBlock(this,0,Size);
  ResetCurrAlignment(this);
  DbgVerifyList(this);
  return;
}

Assistant:

explicit VariableSizeAllocationsManager(const CreateInfo& CI)
        // clang-format off
        : m_FreeBlocksByOffset{STD_ALLOCATOR_RAW_MEM(TFreeBlocksByOffsetMap::value_type, CI.Allocator, "Allocator for map<OffsetType, FreeBlockInfo>")}
        , m_FreeBlocksBySize  {STD_ALLOCATOR_RAW_MEM(TFreeBlocksBySizeMap::value_type,   CI.Allocator, "Allocator for multimap<OffsetType, TFreeBlocksByOffsetMap::iterator>")}
        , m_MaxSize {CI.MaxSize}
        , m_FreeSize{CI.MaxSize}
#ifdef DILIGENT_DEBUG
        , m_DbgDisableDebugValidation{CI.DbgDisableDebugValidation}
#endif
    // clang-format on
    {
        // Insert single maximum-size block
        AddNewBlock(0, m_MaxSize);
        ResetCurrAlignment();

#ifdef DILIGENT_DEBUG
        DbgVerifyList();
#endif
    }